

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space.h
# Opt level: O0

void __thiscall
projects::dpg::ProductUniformFESpace<double>::ProductUniformFESpace
          (ProductUniformFESpace<double> *this,shared_ptr<const_lf::mesh::Mesh> *mesh_p,
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          *rfs_tria_v,
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          *rfs_quad_v,
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          *rfs_edge_v,
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          *rfs_point_v)

{
  size_type sVar1;
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  *rfs_point_v_local;
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  *rfs_edge_v_local;
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  *rfs_quad_v_local;
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  *rfs_tria_v_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  ProductUniformFESpace<double> *this_local;
  
  this->_vptr_ProductUniformFESpace = (_func_int **)&PTR__ProductUniformFESpace_008978b8;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&this->mesh_p_,mesh_p);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::vector(&this->rfs_tria_v_,rfs_tria_v);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::vector(&this->rfs_quad_v_,rfs_quad_v);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::vector(&this->rfs_edge_v_,rfs_edge_v);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::vector(&this->rfs_point_v_,rfs_point_v);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->num_rsf_node_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->num_rsf_edge_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->num_rsf_tria_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->num_rsf_quad_);
  std::
  unique_ptr<projects::dpg::ProductUniformFEDofHandler,std::default_delete<projects::dpg::ProductUniformFEDofHandler>>
  ::unique_ptr<std::default_delete<projects::dpg::ProductUniformFEDofHandler>,void>
            ((unique_ptr<projects::dpg::ProductUniformFEDofHandler,std::default_delete<projects::dpg::ProductUniformFEDofHandler>>
              *)&this->dofh_p_);
  this->numComponents_ = 0;
  sVar1 = std::
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          ::size(&this->rfs_tria_v_);
  this->numComponents_ = (size_type)sVar1;
  init(this,(EVP_PKEY_CTX *)rfs_point_v);
  return;
}

Assistant:

ProductUniformFESpace(
      std::shared_ptr<const lf::mesh::Mesh> mesh_p,
      std::vector<
          std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>>
          rfs_tria_v,
      std::vector<
          std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>>
          rfs_quad_v,
      std::vector<
          std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>>
          rfs_edge_v,
      std::vector<
          std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>>
          rfs_point_v)
      : mesh_p_(std::move(mesh_p)),
        rfs_tria_v_(std::move(rfs_tria_v)),
        rfs_quad_v_(std::move(rfs_quad_v)),
        rfs_edge_v_(std::move(rfs_edge_v)),
        rfs_point_v_(std::move(rfs_point_v)) {
    numComponents_ = rfs_tria_v_.size();
    init();
  }